

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::incoming_allowed_fast(peer_connection *this,piece_index_t index)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  piece_picker *this_00;
  bool local_9f;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_79;
  int local_78;
  int local_74;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_70;
  int local_6c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_68;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_64;
  undefined4 local_60;
  uint local_5c;
  __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_58;
  shared_ptr<libtorrent::peer_plugin> *e;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  peer_connection *this_local;
  piece_index_t index_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local._4_4_ = index.m_val;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
  peer_log(this,incoming_message,"ALLOWED_FAST","%d",(ulong)uVar2);
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
           ::begin(&this->m_extensions);
  e = (shared_ptr<libtorrent::peer_plugin> *)
      ::std::__cxx11::
      list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
      ::end(&this->m_extensions);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&e), bVar1) {
    local_58 = (__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator*
                            (&__end2);
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_58);
    local_5c = this_local._4_4_;
    uVar2 = (*peVar4->_vptr_peer_plugin[0x11])(peVar4,(ulong)(uint)this_local._4_4_);
    if ((uVar2 & 1) != 0) {
      local_60 = 1;
      goto LAB_0044be12;
    }
    ::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end2);
  }
  uVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if ((uVar2 & 1) == 0) {
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_64,0);
    bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                       ((long)&this_local + 4),&local_64);
    if (bVar1) {
      uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
      peer_log(this,incoming_message,"INVALID_ALLOWED_FAST","%d",(ulong)uVar2);
      local_60 = 1;
    }
    else {
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      bVar1 = torrent::valid_metadata(peVar5);
      if (bVar1) {
        local_68 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   ::end_index(&(this->super_peer_connection_hot_members).m_have_piece);
        bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                          ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                           ((long)&this_local + 4),&local_68);
        if (bVar1) {
          uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
          uVar3 = bitfield::size((bitfield *)&this->super_peer_connection_hot_members);
          peer_log(this,incoming_message,"INVALID_ALLOWED_FAST","%d s: %d",(ulong)uVar2,(ulong)uVar3
                  );
          local_60 = 1;
          goto LAB_0044be12;
        }
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
        local_6c = this_local._4_4_;
        bVar1 = torrent::have_piece(peVar5,this_local._4_4_);
        if (bVar1) {
          local_60 = 1;
          goto LAB_0044be12;
        }
      }
      ::std::
      vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ::push_back(&this->m_allowed_fast,(value_type *)((long)&this_local + 4));
      local_70 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                 ::end_index(&(this->super_peer_connection_hot_members).m_have_piece);
      bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                         ((long)&this_local + 4),&local_70);
      local_9f = false;
      if (bVar1) {
        local_74 = this_local._4_4_;
        bVar1 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                ::operator[](&(this->super_peer_connection_hot_members).m_have_piece,
                             (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                             this_local._4_4_);
        local_9f = false;
        if (bVar1) {
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_28);
          local_78 = this_local._4_4_;
          bVar1 = torrent::has_piece_passed(peVar5,this_local._4_4_);
          local_9f = false;
          if (!bVar1) {
            peVar5 = ::std::
                     __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_28);
            bVar1 = torrent::valid_metadata(peVar5);
            local_9f = false;
            if (bVar1) {
              peVar5 = ::std::
                       __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_28);
              bVar1 = torrent::has_picker(peVar5);
              local_9f = false;
              if (bVar1) {
                peVar5 = ::std::
                         __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_28);
                this_00 = torrent::picker(peVar5);
                local_79.m_val = (uchar)piece_picker::piece_priority(this_00,this_local._4_4_);
                local_9f = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::
                           operator>(&local_79,
                                     (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                      *)&dont_download);
              }
            }
          }
        }
      }
      if (local_9f != false) {
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
        torrent::peer_is_interesting(peVar5,this);
      }
      local_60 = 0;
    }
  }
  else {
    local_60 = 1;
  }
LAB_0044be12:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return;
}

Assistant:

void peer_connection::incoming_allowed_fast(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "ALLOWED_FAST", "%d"
			, static_cast<int>(index));
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_allowed_fast(index)) return;
		}
#endif
		if (is_disconnecting()) return;

		if (index < piece_index_t(0))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "INVALID_ALLOWED_FAST"
				, "%d", static_cast<int>(index));
#endif
			return;
		}

		if (t->valid_metadata())
		{
			if (index >= m_have_piece.end_index())
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "INVALID_ALLOWED_FAST"
					, "%d s: %d", static_cast<int>(index), m_have_piece.size());
#endif
				return;
			}

			// if we already have the piece, we can
			// ignore this message
			if (t->have_piece(index))
				return;
		}

		// if we don't have the metadata, we'll verify
		// this piece index later
		m_allowed_fast.push_back(index);

		// if the peer has the piece and we want
		// to download it, request it
		if (index < m_have_piece.end_index()
			&& m_have_piece[index]
			&& !t->has_piece_passed(index)
			&& t->valid_metadata()
			&& t->has_picker()
			&& t->picker().piece_priority(index) > dont_download)
		{
			t->peer_is_interesting(*this);
		}
	}